

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O1

string_view
winmd::reader::read<std::basic_string_view<char,std::char_traits<char>>>(byte_view *cursor)

{
  byte bVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  string_view sVar7;
  string local_40;
  
  pbVar2 = cursor->m_first;
  bVar1 = *pbVar2;
  uVar6 = (uint)bVar1;
  uVar5 = 1;
  if ((char)bVar1 < '\0') {
    uVar5 = (uint)bVar1;
    if ((uVar6 & 0xffffffc0) == 0x80) {
      pbVar4 = pbVar2 + 1;
      uVar6 = (uVar5 & 0x3f) << 8;
      uVar5 = 2;
    }
    else {
      if ((uVar5 & 0xffffffe0) != 0xc0) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Invalid compressed integer in blob","");
        impl::throw_invalid(&local_40);
      }
      pbVar4 = pbVar2 + 3;
      uVar6 = (uint)pbVar2[2] << 8 | (uint)pbVar2[1] << 0x10 | (uVar5 & 0x1f) << 0x18;
      uVar5 = 4;
    }
    uVar6 = *pbVar4 | uVar6;
  }
  byte_view::check_available(cursor,uVar5);
  puVar3 = cursor->m_first;
  cursor->m_first = puVar3 + uVar5;
  byte_view::check_available(cursor,uVar6);
  cursor->m_first = cursor->m_first + uVar6;
  sVar7._M_str = (char *)(puVar3 + uVar5);
  sVar7._M_len = (ulong)uVar6;
  return sVar7;
}

Assistant:

inline std::string_view read<std::string_view>(byte_view& cursor)
    {
        uint32_t const length = uncompress_unsigned(cursor);
        std::string_view result{ reinterpret_cast<const char*>(cursor.begin()), length };
        cursor = cursor.seek(length);
        return result;
    }